

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

double __thiscall ON_Displacement::RefineSensitivity(ON_Displacement *this)

{
  ON_InternalXMLImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,0.5);
  ON_InternalXMLImpl::GetParameter(&local_200,this_00,L"refine-sensitivity",&local_108);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_Displacement::RefineSensitivity(void) const
{
  return m_impl->GetParameter(ON_DISPLACEMENT_REFINE_SENSITIVITY, 0.5).AsDouble();
}